

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O0

void swrenderer::R_3D_ResetClip(void)

{
  void *block;
  
  clip_cur = clip_top;
  while( true ) {
    if (clip_cur == (void *)0x0) {
      clip_top = (void *)0x0;
      clip_cur = (void *)0x0;
      return;
    }
    if (*(long *)(*(long *)((long)clip_cur + 0x5a00) + 0x80) == 0) break;
    if (*(long *)(*(long *)((long)clip_cur + 0x5a00) + 0x88) == 0) {
      __assert_fail("clip_cur->ffloor->ceilingclip != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                    ,0x7b,"void swrenderer::R_3D_ResetClip()");
    }
    *(undefined8 *)(*(long *)((long)clip_cur + 0x5a00) + 0x80) = 0;
    *(undefined8 *)(*(long *)((long)clip_cur + 0x5a00) + 0x88) = 0;
    block = clip_cur;
    clip_top = clip_cur;
    clip_cur = *(void **)((long)clip_cur + 0x5a08);
    M_Free(block);
  }
  __assert_fail("clip_cur->ffloor->floorclip != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                ,0x7a,"void swrenderer::R_3D_ResetClip()");
}

Assistant:

void R_3D_ResetClip()
{
	clip_cur = clip_top;
	while(clip_cur) 
	{
		assert(clip_cur->ffloor->floorclip != NULL);
		assert(clip_cur->ffloor->ceilingclip != NULL);
		clip_cur->ffloor->ceilingclip = clip_cur->ffloor->floorclip = NULL;
		clip_top = clip_cur;
		clip_cur = clip_cur->next;
		M_Free(clip_top);
	}
	clip_cur = clip_top = NULL;
}